

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

void __thiscall maths::Matrix::Matrix(Matrix *this,Matrix *m)

{
  double **ppdVar1;
  double **ppdVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int j;
  ulong uVar7;
  
  iVar3 = m->cols_;
  this->rows_ = m->rows_;
  this->cols_ = iVar3;
  allocSpace(this);
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->cols_;
  if (this->cols_ < 1) {
    uVar4 = uVar5;
  }
  uVar6 = (ulong)(uint)this->rows_;
  if (this->rows_ < 1) {
    uVar6 = uVar5;
  }
  for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    ppdVar1 = m->p;
    ppdVar2 = this->p;
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      ppdVar2[uVar5][uVar7] = ppdVar1[uVar5][uVar7];
    }
  }
  return;
}

Assistant:

Matrix::Matrix(const Matrix& m) : rows_(m.rows_), cols_(m.cols_)
{
    allocSpace();
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] = m.p[i][j];
        }
    }
}